

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTag
          (UnknownField *this,CodedOutputStream *output)

{
  UnknownFieldSet *pUVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->type_ != 3) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x145);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type()): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pUVar1 = (this->data_).group_;
  io::CodedOutputStream::WriteVarint32(output,*(uint32 *)&pUVar1[1].fields_);
  io::CodedOutputStream::WriteRawMaybeAliased(output,pUVar1->fields_,*(int *)&pUVar1[1].fields_);
  return;
}

Assistant:

void UnknownField::SerializeLengthDelimitedNoTag(
    io::CodedOutputStream* output) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const string& data = *data_.length_delimited_.string_value_;
  output->WriteVarint32(data.size());
  output->WriteRawMaybeAliased(data.data(), data.size());
}